

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

void exp_consttime_precomp
               (uint32_t *n,uint32_t mu,uint32_t *r2,uint32_t *a,uint32_t bBits,uint32_t *b,
               uint32_t *res)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t *ctx_n_9;
  uint32_t x_239;
  uint32_t *os_239;
  uint32_t x_238;
  uint32_t *os_238;
  uint32_t x_237;
  uint32_t *os_237;
  uint32_t x_236;
  uint32_t *os_236;
  uint32_t x_235;
  uint32_t *os_235;
  uint32_t x_234;
  uint32_t *os_234;
  uint32_t x_233;
  uint32_t *os_233;
  uint32_t x_232;
  uint32_t *os_232;
  uint32_t i_33;
  uint32_t *res_j_29;
  uint32_t c_29;
  uint32_t x_231;
  uint32_t *os_231;
  uint32_t x_230;
  uint32_t *os_230;
  uint32_t x_229;
  uint32_t *os_229;
  uint32_t x_228;
  uint32_t *os_228;
  uint32_t x_227;
  uint32_t *os_227;
  uint32_t x_226;
  uint32_t *os_226;
  uint32_t x_225;
  uint32_t *os_225;
  uint32_t x_224;
  uint32_t *os_224;
  uint32_t i_32;
  uint32_t *res_j_28;
  uint32_t c_28;
  uint32_t x_223;
  uint32_t *os_223;
  uint32_t x_222;
  uint32_t *os_222;
  uint32_t x_221;
  uint32_t *os_221;
  uint32_t x_220;
  uint32_t *os_220;
  uint32_t x_219;
  uint32_t *os_219;
  uint32_t x_218;
  uint32_t *os_218;
  uint32_t x_217;
  uint32_t *os_217;
  uint32_t x_216;
  uint32_t *os_216;
  uint32_t i_31;
  uint32_t *res_j_27;
  uint32_t c_27;
  uint32_t x_215;
  uint32_t *os_215;
  uint32_t x_214;
  uint32_t *os_214;
  uint32_t x_213;
  uint32_t *os_213;
  uint32_t x_212;
  uint32_t *os_212;
  uint32_t x_211;
  uint32_t *os_211;
  uint32_t x_210;
  uint32_t *os_210;
  uint32_t x_209;
  uint32_t *os_209;
  uint32_t x_208;
  uint32_t *os_208;
  uint32_t i_30;
  uint32_t *res_j_26;
  uint32_t c_26;
  uint32_t x_207;
  uint32_t *os_207;
  uint32_t x_206;
  uint32_t *os_206;
  uint32_t x_205;
  uint32_t *os_205;
  uint32_t x_204;
  uint32_t *os_204;
  uint32_t x_203;
  uint32_t *os_203;
  uint32_t x_202;
  uint32_t *os_202;
  uint32_t x_201;
  uint32_t *os_201;
  uint32_t x_200;
  uint32_t *os_200;
  uint32_t i_29;
  uint32_t *res_j_25;
  uint32_t c_25;
  uint32_t x_199;
  uint32_t *os_199;
  uint32_t x_198;
  uint32_t *os_198;
  uint32_t x_197;
  uint32_t *os_197;
  uint32_t x_196;
  uint32_t *os_196;
  uint32_t x_195;
  uint32_t *os_195;
  uint32_t x_194;
  uint32_t *os_194;
  uint32_t x_193;
  uint32_t *os_193;
  uint32_t x_192;
  uint32_t *os_192;
  uint32_t i_28;
  uint32_t *res_j_24;
  uint32_t c_24;
  uint32_t x_191;
  uint32_t *os_191;
  uint32_t x_190;
  uint32_t *os_190;
  uint32_t x_189;
  uint32_t *os_189;
  uint32_t x_188;
  uint32_t *os_188;
  uint32_t x_187;
  uint32_t *os_187;
  uint32_t x_186;
  uint32_t *os_186;
  uint32_t x_185;
  uint32_t *os_185;
  uint32_t x_184;
  uint32_t *os_184;
  uint32_t i_27;
  uint32_t *res_j_23;
  uint32_t c_23;
  uint32_t x_183;
  uint32_t *os_183;
  uint32_t x_182;
  uint32_t *os_182;
  uint32_t x_181;
  uint32_t *os_181;
  uint32_t x_180;
  uint32_t *os_180;
  uint32_t x_179;
  uint32_t *os_179;
  uint32_t x_178;
  uint32_t *os_178;
  uint32_t x_177;
  uint32_t *os_177;
  uint32_t x_176;
  uint32_t *os_176;
  uint32_t i_26;
  uint32_t *res_j_22;
  uint32_t c_22;
  uint32_t x_175;
  uint32_t *os_175;
  uint32_t x_174;
  uint32_t *os_174;
  uint32_t x_173;
  uint32_t *os_173;
  uint32_t x_172;
  uint32_t *os_172;
  uint32_t x_171;
  uint32_t *os_171;
  uint32_t x_170;
  uint32_t *os_170;
  uint32_t x_169;
  uint32_t *os_169;
  uint32_t x_168;
  uint32_t *os_168;
  uint32_t i_25;
  uint32_t *res_j_21;
  uint32_t c_21;
  uint32_t x_167;
  uint32_t *os_167;
  uint32_t x_166;
  uint32_t *os_166;
  uint32_t x_165;
  uint32_t *os_165;
  uint32_t x_164;
  uint32_t *os_164;
  uint32_t x_163;
  uint32_t *os_163;
  uint32_t x_162;
  uint32_t *os_162;
  uint32_t x_161;
  uint32_t *os_161;
  uint32_t x_160;
  uint32_t *os_160;
  uint32_t i_24;
  uint32_t *res_j_20;
  uint32_t c_20;
  uint32_t x_159;
  uint32_t *os_159;
  uint32_t x_158;
  uint32_t *os_158;
  uint32_t x_157;
  uint32_t *os_157;
  uint32_t x_156;
  uint32_t *os_156;
  uint32_t x_155;
  uint32_t *os_155;
  uint32_t x_154;
  uint32_t *os_154;
  uint32_t x_153;
  uint32_t *os_153;
  uint32_t x_152;
  uint32_t *os_152;
  uint32_t i_23;
  uint32_t *res_j_19;
  uint32_t c_19;
  uint32_t x_151;
  uint32_t *os_151;
  uint32_t x_150;
  uint32_t *os_150;
  uint32_t x_149;
  uint32_t *os_149;
  uint32_t x_148;
  uint32_t *os_148;
  uint32_t x_147;
  uint32_t *os_147;
  uint32_t x_146;
  uint32_t *os_146;
  uint32_t x_145;
  uint32_t *os_145;
  uint32_t x_144;
  uint32_t *os_144;
  uint32_t i_22;
  uint32_t *res_j_18;
  uint32_t c_18;
  uint32_t x_143;
  uint32_t *os_143;
  uint32_t x_142;
  uint32_t *os_142;
  uint32_t x_141;
  uint32_t *os_141;
  uint32_t x_140;
  uint32_t *os_140;
  uint32_t x_139;
  uint32_t *os_139;
  uint32_t x_138;
  uint32_t *os_138;
  uint32_t x_137;
  uint32_t *os_137;
  uint32_t x_136;
  uint32_t *os_136;
  uint32_t i_21;
  uint32_t *res_j_17;
  uint32_t c_17;
  uint32_t x_135;
  uint32_t *os_135;
  uint32_t x_134;
  uint32_t *os_134;
  uint32_t x_133;
  uint32_t *os_133;
  uint32_t x_132;
  uint32_t *os_132;
  uint32_t x_131;
  uint32_t *os_131;
  uint32_t x_130;
  uint32_t *os_130;
  uint32_t x_129;
  uint32_t *os_129;
  uint32_t x_128;
  uint32_t *os_128;
  uint32_t i_20;
  uint32_t *res_j_16;
  uint32_t c_16;
  uint32_t x_127;
  uint32_t *os_127;
  uint32_t x_126;
  uint32_t *os_126;
  uint32_t x_125;
  uint32_t *os_125;
  uint32_t x_124;
  uint32_t *os_124;
  uint32_t x_123;
  uint32_t *os_123;
  uint32_t x_122;
  uint32_t *os_122;
  uint32_t x_121;
  uint32_t *os_121;
  uint32_t x_120;
  uint32_t *os_120;
  uint32_t i_19;
  uint32_t *res_j_15;
  uint32_t c_15;
  uint32_t i1_2;
  uint32_t bits_l;
  uint32_t k;
  uint32_t *ctx_n_13;
  uint32_t *ctx_n_12;
  uint32_t *ctx_n_11;
  uint32_t *ctx_n_10;
  uint32_t i_18;
  uint32_t i0_2;
  uint32_t tmp0 [8];
  uint32_t *ctx_r2_1;
  uint32_t *ctx_n_8;
  uint32_t x_119;
  uint32_t *os_119;
  uint32_t x_118;
  uint32_t *os_118;
  uint32_t x_117;
  uint32_t *os_117;
  uint32_t x_116;
  uint32_t *os_116;
  uint32_t x_115;
  uint32_t *os_115;
  uint32_t x_114;
  uint32_t *os_114;
  uint32_t x_113;
  uint32_t *os_113;
  uint32_t x_112;
  uint32_t *os_112;
  uint32_t i_17;
  uint32_t *res_j_14;
  uint32_t c_14;
  uint32_t x_111;
  uint32_t *os_111;
  uint32_t x_110;
  uint32_t *os_110;
  uint32_t x_109;
  uint32_t *os_109;
  uint32_t x_108;
  uint32_t *os_108;
  uint32_t x_107;
  uint32_t *os_107;
  uint32_t x_106;
  uint32_t *os_106;
  uint32_t x_105;
  uint32_t *os_105;
  uint32_t x_104;
  uint32_t *os_104;
  uint32_t i_16;
  uint32_t *res_j_13;
  uint32_t c_13;
  uint32_t x_103;
  uint32_t *os_103;
  uint32_t x_102;
  uint32_t *os_102;
  uint32_t x_101;
  uint32_t *os_101;
  uint32_t x_100;
  uint32_t *os_100;
  uint32_t x_99;
  uint32_t *os_99;
  uint32_t x_98;
  uint32_t *os_98;
  uint32_t x_97;
  uint32_t *os_97;
  uint32_t x_96;
  uint32_t *os_96;
  uint32_t i_15;
  uint32_t *res_j_12;
  uint32_t c_12;
  uint32_t x_95;
  uint32_t *os_95;
  uint32_t x_94;
  uint32_t *os_94;
  uint32_t x_93;
  uint32_t *os_93;
  uint32_t x_92;
  uint32_t *os_92;
  uint32_t x_91;
  uint32_t *os_91;
  uint32_t x_90;
  uint32_t *os_90;
  uint32_t x_89;
  uint32_t *os_89;
  uint32_t x_88;
  uint32_t *os_88;
  uint32_t i_14;
  uint32_t *res_j_11;
  uint32_t c_11;
  uint32_t x_87;
  uint32_t *os_87;
  uint32_t x_86;
  uint32_t *os_86;
  uint32_t x_85;
  uint32_t *os_85;
  uint32_t x_84;
  uint32_t *os_84;
  uint32_t x_83;
  uint32_t *os_83;
  uint32_t x_82;
  uint32_t *os_82;
  uint32_t x_81;
  uint32_t *os_81;
  uint32_t x_80;
  uint32_t *os_80;
  uint32_t i_13;
  uint32_t *res_j_10;
  uint32_t c_10;
  uint32_t x_79;
  uint32_t *os_79;
  uint32_t x_78;
  uint32_t *os_78;
  uint32_t x_77;
  uint32_t *os_77;
  uint32_t x_76;
  uint32_t *os_76;
  uint32_t x_75;
  uint32_t *os_75;
  uint32_t x_74;
  uint32_t *os_74;
  uint32_t x_73;
  uint32_t *os_73;
  uint32_t x_72;
  uint32_t *os_72;
  uint32_t i_12;
  uint32_t *res_j_9;
  uint32_t c_9;
  uint32_t x_71;
  uint32_t *os_71;
  uint32_t x_70;
  uint32_t *os_70;
  uint32_t x_69;
  uint32_t *os_69;
  uint32_t x_68;
  uint32_t *os_68;
  uint32_t x_67;
  uint32_t *os_67;
  uint32_t x_66;
  uint32_t *os_66;
  uint32_t x_65;
  uint32_t *os_65;
  uint32_t x_64;
  uint32_t *os_64;
  uint32_t i_11;
  uint32_t *res_j_8;
  uint32_t c_8;
  uint32_t x_63;
  uint32_t *os_63;
  uint32_t x_62;
  uint32_t *os_62;
  uint32_t x_61;
  uint32_t *os_61;
  uint32_t x_60;
  uint32_t *os_60;
  uint32_t x_59;
  uint32_t *os_59;
  uint32_t x_58;
  uint32_t *os_58;
  uint32_t x_57;
  uint32_t *os_57;
  uint32_t x_56;
  uint32_t *os_56;
  uint32_t i_10;
  uint32_t *res_j_7;
  uint32_t c_7;
  uint32_t x_55;
  uint32_t *os_55;
  uint32_t x_54;
  uint32_t *os_54;
  uint32_t x_53;
  uint32_t *os_53;
  uint32_t x_52;
  uint32_t *os_52;
  uint32_t x_51;
  uint32_t *os_51;
  uint32_t x_50;
  uint32_t *os_50;
  uint32_t x_49;
  uint32_t *os_49;
  uint32_t x_48;
  uint32_t *os_48;
  uint32_t i_9;
  uint32_t *res_j_6;
  uint32_t c_6;
  uint32_t x_47;
  uint32_t *os_47;
  uint32_t x_46;
  uint32_t *os_46;
  uint32_t x_45;
  uint32_t *os_45;
  uint32_t x_44;
  uint32_t *os_44;
  uint32_t x_43;
  uint32_t *os_43;
  uint32_t x_42;
  uint32_t *os_42;
  uint32_t x_41;
  uint32_t *os_41;
  uint32_t x_40;
  uint32_t *os_40;
  uint32_t i_8;
  uint32_t *res_j_5;
  uint32_t c_5;
  uint32_t x_39;
  uint32_t *os_39;
  uint32_t x_38;
  uint32_t *os_38;
  uint32_t x_37;
  uint32_t *os_37;
  uint32_t x_36;
  uint32_t *os_36;
  uint32_t x_35;
  uint32_t *os_35;
  uint32_t x_34;
  uint32_t *os_34;
  uint32_t x_33;
  uint32_t *os_33;
  uint32_t x_32;
  uint32_t *os_32;
  uint32_t i_7;
  uint32_t *res_j_4;
  uint32_t c_4;
  uint32_t x_31;
  uint32_t *os_31;
  uint32_t x_30;
  uint32_t *os_30;
  uint32_t x_29;
  uint32_t *os_29;
  uint32_t x_28;
  uint32_t *os_28;
  uint32_t x_27;
  uint32_t *os_27;
  uint32_t x_26;
  uint32_t *os_26;
  uint32_t x_25;
  uint32_t *os_25;
  uint32_t x_24;
  uint32_t *os_24;
  uint32_t i_6;
  uint32_t *res_j_3;
  uint32_t c_3;
  uint32_t x_23;
  uint32_t *os_23;
  uint32_t x_22;
  uint32_t *os_22;
  uint32_t x_21;
  uint32_t *os_21;
  uint32_t x_20;
  uint32_t *os_20;
  uint32_t x_19;
  uint32_t *os_19;
  uint32_t x_18;
  uint32_t *os_18;
  uint32_t x_17;
  uint32_t *os_17;
  uint32_t x_16;
  uint32_t *os_16;
  uint32_t i_5;
  uint32_t *res_j_2;
  uint32_t c_2;
  uint32_t x_15;
  uint32_t *os_15;
  uint32_t x_14;
  uint32_t *os_14;
  uint32_t x_13;
  uint32_t *os_13;
  uint32_t x_12;
  uint32_t *os_12;
  uint32_t x_11;
  uint32_t *os_11;
  uint32_t x_10;
  uint32_t *os_10;
  uint32_t x_9;
  uint32_t *os_9;
  uint32_t x_8;
  uint32_t *os_8;
  uint32_t i_4;
  uint32_t *res_j_1;
  uint32_t c_1;
  uint32_t x_7;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t *os_4;
  uint32_t x_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t *os;
  uint32_t i_3;
  uint32_t *res_j;
  uint32_t c;
  uint32_t i1_1;
  uint32_t bits_c;
  uint32_t i0_1;
  uint32_t *ctx_n_7;
  uint32_t *t2_6;
  uint32_t *ctx_n1_7;
  uint32_t *t11_6;
  uint32_t *ctx_n_6;
  uint32_t *t2_5;
  uint32_t *ctx_n1_6;
  uint32_t *t11_5;
  uint32_t *ctx_n_5;
  uint32_t *t2_4;
  uint32_t *ctx_n1_5;
  uint32_t *t11_4;
  uint32_t *ctx_n_4;
  uint32_t *t2_3;
  uint32_t *ctx_n1_4;
  uint32_t *t11_3;
  uint32_t *ctx_n_3;
  uint32_t *t2_2;
  uint32_t *ctx_n1_3;
  uint32_t *t11_2;
  uint32_t *ctx_n_2;
  uint32_t *t2_1;
  uint32_t *ctx_n1_2;
  uint32_t *t11_1;
  uint32_t *ctx_n_1;
  uint32_t *t2;
  uint32_t *ctx_n1_1;
  uint32_t *t11;
  uint32_t i_2;
  uint32_t *ctx_r20;
  uint32_t *ctx_n0;
  uint32_t *t1;
  uint32_t *t0;
  uint32_t tmp [8];
  uint32_t table [128];
  uint32_t ctx [16];
  uint32_t local_18c;
  uint32_t uStack_188;
  uint32_t bLen;
  uint32_t resM [8];
  uint32_t aM [8];
  uint32_t dummy_15;
  uint32_t dummy_14;
  uint32_t dummy_13;
  uint32_t dummy_12;
  uint32_t dummy_11;
  uint32_t dummy_10;
  uint32_t dummy_9;
  uint32_t dummy_8;
  uint32_t i_1;
  uint32_t sw0;
  uint32_t *ctx_n1;
  uint32_t *ctx_n0_1;
  uint32_t dummy_7;
  uint32_t dummy_6;
  uint32_t dummy_5;
  uint32_t dummy_4;
  uint32_t dummy_3;
  uint32_t dummy_2;
  uint32_t dummy_1;
  uint32_t dummy;
  uint32_t i;
  uint32_t sw1;
  uint32_t bit;
  uint32_t tmp_1;
  uint32_t j;
  uint32_t i1;
  uint32_t i0;
  uint32_t *ctx_r2;
  uint32_t *ctx_n;
  undefined8 uStack_b8;
  uint32_t sw;
  uint32_t ctx_1 [16];
  uint32_t resM_1 [8];
  uint32_t aM_1 [8];
  uint32_t *b_local;
  uint32_t bBits_local;
  uint32_t *a_local;
  uint32_t *r2_local;
  uint32_t mu_local;
  uint32_t *n_local;
  
  if (bBits < 200) {
    memset(resM_1 + 6,0,0x20);
    to(n,mu,r2,a,resM_1 + 6);
    memset(ctx_1 + 0xe,0,0x20);
    memset(&stack0xffffffffffffff48,0,0x40);
    uStack_b8 = *(undefined8 *)n;
    ctx_1._0_8_ = *(undefined8 *)(n + 2);
    ctx_1._8_8_ = *(undefined8 *)(n + 4);
    ctx_1._16_8_ = *(undefined8 *)(n + 6);
    ctx_1._24_8_ = *(undefined8 *)r2;
    ctx_1._32_8_ = *(undefined8 *)(r2 + 2);
    ctx_1._40_8_ = *(undefined8 *)(r2 + 4);
    ctx_1._48_8_ = *(undefined8 *)(r2 + 6);
    ctx_n._4_4_ = 0;
    from((uint32_t *)&stack0xffffffffffffff48,mu,ctx_1 + 6,ctx_1 + 0xe);
    for (j = 0; j < bBits; j = j + 1) {
      uVar1 = b[(bBits - j) - 1 >> 5] >> (((char)bBits - (char)j) - 1U & 0x1f) & 1;
      uVar2 = uVar1 ^ ctx_n._4_4_;
      uVar3 = -uVar2 & (ctx_1[0xe] ^ resM_1[6]);
      ctx_1[0xe] = ctx_1[0xe] ^ uVar3;
      resM_1[6] = resM_1[6] ^ uVar3;
      uVar3 = -uVar2 & (ctx_1[0xf] ^ resM_1[7]);
      ctx_1[0xf] = ctx_1[0xf] ^ uVar3;
      resM_1[7] = resM_1[7] ^ uVar3;
      uVar3 = -uVar2 & (resM_1[0] ^ aM_1[0]);
      resM_1[0] = resM_1[0] ^ uVar3;
      aM_1[0] = aM_1[0] ^ uVar3;
      uVar3 = -uVar2 & (resM_1[1] ^ aM_1[1]);
      resM_1[1] = resM_1[1] ^ uVar3;
      aM_1[1] = aM_1[1] ^ uVar3;
      uVar3 = -uVar2 & (resM_1[2] ^ aM_1[2]);
      resM_1[2] = resM_1[2] ^ uVar3;
      aM_1[2] = aM_1[2] ^ uVar3;
      uVar3 = -uVar2 & (resM_1[3] ^ aM_1[3]);
      resM_1[3] = resM_1[3] ^ uVar3;
      aM_1[3] = aM_1[3] ^ uVar3;
      uVar3 = -uVar2 & (resM_1[4] ^ aM_1[4]);
      resM_1[4] = resM_1[4] ^ uVar3;
      aM_1[4] = aM_1[4] ^ uVar3;
      uVar2 = -uVar2 & (resM_1[5] ^ aM_1[5]);
      resM_1[5] = resM_1[5] ^ uVar2;
      aM_1[5] = aM_1[5] ^ uVar2;
      amont_mul((uint32_t *)&stack0xffffffffffffff48,mu,resM_1 + 6,ctx_1 + 0xe,resM_1 + 6);
      amont_sqr((uint32_t *)&stack0xffffffffffffff48,mu,ctx_1 + 0xe,ctx_1 + 0xe);
      ctx_n._4_4_ = uVar1;
    }
    uVar1 = -ctx_n._4_4_ & (ctx_1[0xe] ^ resM_1[6]);
    ctx_1[0xe] = ctx_1[0xe] ^ uVar1;
    resM_1[6] = resM_1[6] ^ uVar1;
    uVar1 = -ctx_n._4_4_ & (ctx_1[0xf] ^ resM_1[7]);
    ctx_1[0xf] = ctx_1[0xf] ^ uVar1;
    resM_1[7] = resM_1[7] ^ uVar1;
    resM_1[0] = resM_1[0] ^ -ctx_n._4_4_ & (resM_1[0] ^ aM_1[0]);
    resM_1[1] = resM_1[1] ^ -ctx_n._4_4_ & (resM_1[1] ^ aM_1[1]);
    resM_1[2] = resM_1[2] ^ -ctx_n._4_4_ & (resM_1[2] ^ aM_1[2]);
    resM_1[3] = resM_1[3] ^ -ctx_n._4_4_ & (resM_1[3] ^ aM_1[3]);
    resM_1[4] = resM_1[4] ^ -ctx_n._4_4_ & (resM_1[4] ^ aM_1[4]);
    resM_1[5] = resM_1[5] ^ -ctx_n._4_4_ & (resM_1[5] ^ aM_1[5]);
    from(n,mu,ctx_1 + 0xe,res);
  }
  else {
    memset(resM + 6,0,0x20);
    to(n,mu,r2,a,resM + 6);
    memset(&uStack_188,0,0x20);
    if (bBits == 0) {
      local_18c = 1;
    }
    else {
      local_18c = (bBits - 1 >> 5) + 1;
    }
    memset(table + 0x7e,0,0x40);
    table._504_8_ = *(undefined8 *)n;
    ctx._0_8_ = *(undefined8 *)(n + 2);
    ctx._8_8_ = *(undefined8 *)(n + 4);
    ctx._16_8_ = *(undefined8 *)(n + 6);
    ctx._24_8_ = *(undefined8 *)r2;
    ctx._32_8_ = *(undefined8 *)(r2 + 2);
    ctx._40_8_ = *(undefined8 *)(r2 + 4);
    ctx._48_8_ = *(undefined8 *)(r2 + 6);
    memset(tmp + 6,0,0x200);
    memset(&t0,0,0x20);
    from(table + 0x7e,mu,ctx + 6,tmp + 6);
    table[6] = resM[6];
    table[7] = resM[7];
    amont_sqr(table + 0x7e,mu,table + 6,(uint32_t *)&t0);
    table._56_8_ = t0;
    table[0x10] = tmp[0];
    table[0x11] = tmp[1];
    table[0x12] = tmp[2];
    table[0x13] = tmp[3];
    table[0x14] = tmp[4];
    table[0x15] = tmp[5];
    amont_mul(table + 0x7e,mu,resM + 6,table + 0xe,(uint32_t *)&t0);
    table._88_8_ = t0;
    table[0x18] = tmp[0];
    table[0x19] = tmp[1];
    table[0x1a] = tmp[2];
    table[0x1b] = tmp[3];
    table[0x1c] = tmp[4];
    table[0x1d] = tmp[5];
    amont_sqr(table + 0x7e,mu,table + 0xe,(uint32_t *)&t0);
    table._120_8_ = t0;
    table[0x20] = tmp[0];
    table[0x21] = tmp[1];
    table[0x22] = tmp[2];
    table[0x23] = tmp[3];
    table[0x24] = tmp[4];
    table[0x25] = tmp[5];
    amont_mul(table + 0x7e,mu,resM + 6,table + 0x1e,(uint32_t *)&t0);
    table._152_8_ = t0;
    table[0x28] = tmp[0];
    table[0x29] = tmp[1];
    table[0x2a] = tmp[2];
    table[0x2b] = tmp[3];
    table[0x2c] = tmp[4];
    table[0x2d] = tmp[5];
    amont_sqr(table + 0x7e,mu,table + 0x16,(uint32_t *)&t0);
    table._184_8_ = t0;
    table[0x30] = tmp[0];
    table[0x31] = tmp[1];
    table[0x32] = tmp[2];
    table[0x33] = tmp[3];
    table[0x34] = tmp[4];
    table[0x35] = tmp[5];
    amont_mul(table + 0x7e,mu,resM + 6,table + 0x2e,(uint32_t *)&t0);
    table._216_8_ = t0;
    table[0x38] = tmp[0];
    table[0x39] = tmp[1];
    table[0x3a] = tmp[2];
    table[0x3b] = tmp[3];
    table[0x3c] = tmp[4];
    table[0x3d] = tmp[5];
    amont_sqr(table + 0x7e,mu,table + 0x1e,(uint32_t *)&t0);
    table._248_8_ = t0;
    table[0x40] = tmp[0];
    table[0x41] = tmp[1];
    table[0x42] = tmp[2];
    table[0x43] = tmp[3];
    table[0x44] = tmp[4];
    table[0x45] = tmp[5];
    amont_mul(table + 0x7e,mu,resM + 6,table + 0x3e,(uint32_t *)&t0);
    table._280_8_ = t0;
    table[0x48] = tmp[0];
    table[0x49] = tmp[1];
    table[0x4a] = tmp[2];
    table[0x4b] = tmp[3];
    table[0x4c] = tmp[4];
    table[0x4d] = tmp[5];
    amont_sqr(table + 0x7e,mu,table + 0x26,(uint32_t *)&t0);
    table._312_8_ = t0;
    table[0x50] = tmp[0];
    table[0x51] = tmp[1];
    table[0x52] = tmp[2];
    table[0x53] = tmp[3];
    table[0x54] = tmp[4];
    table[0x55] = tmp[5];
    amont_mul(table + 0x7e,mu,resM + 6,table + 0x4e,(uint32_t *)&t0);
    table._344_8_ = t0;
    table[0x58] = tmp[0];
    table[0x59] = tmp[1];
    table[0x5a] = tmp[2];
    table[0x5b] = tmp[3];
    table[0x5c] = tmp[4];
    table[0x5d] = tmp[5];
    amont_sqr(table + 0x7e,mu,table + 0x2e,(uint32_t *)&t0);
    table._376_8_ = t0;
    table[0x60] = tmp[0];
    table[0x61] = tmp[1];
    table[0x62] = tmp[2];
    table[99] = tmp[3];
    table[100] = tmp[4];
    table[0x65] = tmp[5];
    amont_mul(table + 0x7e,mu,resM + 6,table + 0x5e,(uint32_t *)&t0);
    table._408_8_ = t0;
    table[0x68] = tmp[0];
    table[0x69] = tmp[1];
    table[0x6a] = tmp[2];
    table[0x6b] = tmp[3];
    table[0x6c] = tmp[4];
    table[0x6d] = tmp[5];
    amont_sqr(table + 0x7e,mu,table + 0x36,(uint32_t *)&t0);
    table._440_8_ = t0;
    table[0x70] = tmp[0];
    table[0x71] = tmp[1];
    table[0x72] = tmp[2];
    table[0x73] = tmp[3];
    table[0x74] = tmp[4];
    table[0x75] = tmp[5];
    amont_mul(table + 0x7e,mu,resM + 6,table + 0x6e,(uint32_t *)&t0);
    table._472_8_ = t0;
    table[0x78] = tmp[0];
    table[0x79] = tmp[1];
    table[0x7a] = tmp[2];
    table[0x7b] = tmp[3];
    table[0x7c] = tmp[4];
    table[0x7d] = tmp[5];
    if ((bBits & 3) == 0) {
      from(table + 0x7e,mu,ctx + 6,&uStack_188);
    }
    else {
      uVar4 = Hacl_Bignum_Lib_bn_get_bits_u32(local_18c,b,bBits & 0xfffffffc,4);
      uStack_188 = tmp[6];
      bLen = tmp[7];
      resM[0] = table[0];
      resM[1] = table[1];
      resM[2] = table[2];
      resM[3] = table[3];
      resM[4] = table[4];
      resM[5] = table[5];
      FStar_UInt32_eq_mask(uVar4,1);
      FStar_UInt32_eq_mask(uVar4,2);
      FStar_UInt32_eq_mask(uVar4,3);
      FStar_UInt32_eq_mask(uVar4,4);
      FStar_UInt32_eq_mask(uVar4,5);
      FStar_UInt32_eq_mask(uVar4,6);
      FStar_UInt32_eq_mask(uVar4,7);
      FStar_UInt32_eq_mask(uVar4,8);
      FStar_UInt32_eq_mask(uVar4,9);
      FStar_UInt32_eq_mask(uVar4,10);
      FStar_UInt32_eq_mask(uVar4,0xb);
      FStar_UInt32_eq_mask(uVar4,0xc);
      FStar_UInt32_eq_mask(uVar4,0xd);
      FStar_UInt32_eq_mask(uVar4,0xe);
      FStar_UInt32_eq_mask(uVar4,0xf);
    }
    memset(&i_18,0,0x20);
    for (ctx_n_10._4_4_ = 0; ctx_n_10._4_4_ < bBits >> 2; ctx_n_10._4_4_ = ctx_n_10._4_4_ + 1) {
      amont_sqr(table + 0x7e,mu,&uStack_188,&uStack_188);
      amont_sqr(table + 0x7e,mu,&uStack_188,&uStack_188);
      amont_sqr(table + 0x7e,mu,&uStack_188,&uStack_188);
      amont_sqr(table + 0x7e,mu,&uStack_188,&uStack_188);
      uVar4 = Hacl_Bignum_Lib_bn_get_bits_u32
                        (local_18c,b,((bBits - (bBits & 3)) + ctx_n_10._4_4_ * -4) - 4,4);
      i_18 = tmp[6];
      i0_2 = tmp[7];
      tmp0[0] = table[0];
      tmp0[1] = table[1];
      tmp0[2] = table[2];
      tmp0[3] = table[3];
      tmp0[4] = table[4];
      tmp0[5] = table[5];
      FStar_UInt32_eq_mask(uVar4,1);
      FStar_UInt32_eq_mask(uVar4,2);
      FStar_UInt32_eq_mask(uVar4,3);
      FStar_UInt32_eq_mask(uVar4,4);
      FStar_UInt32_eq_mask(uVar4,5);
      FStar_UInt32_eq_mask(uVar4,6);
      FStar_UInt32_eq_mask(uVar4,7);
      FStar_UInt32_eq_mask(uVar4,8);
      FStar_UInt32_eq_mask(uVar4,9);
      FStar_UInt32_eq_mask(uVar4,10);
      FStar_UInt32_eq_mask(uVar4,0xb);
      FStar_UInt32_eq_mask(uVar4,0xc);
      FStar_UInt32_eq_mask(uVar4,0xd);
      FStar_UInt32_eq_mask(uVar4,0xe);
      FStar_UInt32_eq_mask(uVar4,0xf);
      amont_mul(table + 0x7e,mu,&uStack_188,&i_18,&uStack_188);
    }
    from(n,mu,&uStack_188,res);
  }
  return;
}

Assistant:

static inline void
exp_consttime_precomp(
  uint32_t *n,
  uint32_t mu,
  uint32_t *r2,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  if (bBits < 200U)
  {
    uint32_t aM[8U] = { 0U };
    to(n, mu, r2, a, aM);
    uint32_t resM[8U] = { 0U };
    uint32_t ctx[16U] = { 0U };
    memcpy(ctx, n, 8U * sizeof (uint32_t));
    memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;);
      uint32_t *ctx_n0 = ctx;
      amont_mul(ctx_n0, mu, aM, resM, aM);
      uint32_t *ctx_n1 = ctx;
      amont_sqr(ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    KRML_MAYBE_FOR8(i,
      0U,
      8U,
      1U,
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;);
    from(n, mu, resM, res);
    return;
  }
  uint32_t aM[8U] = { 0U };
  to(n, mu, r2, a, aM);
  uint32_t resM[8U] = { 0U };
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 32U + 1U;
  }
  uint32_t ctx[16U] = { 0U };
  memcpy(ctx, n, 8U * sizeof (uint32_t));
  memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
  uint32_t table[128U] = { 0U };
  uint32_t tmp[8U] = { 0U };
  uint32_t *t0 = table;
  uint32_t *t1 = table + 8U;
  uint32_t *ctx_n0 = ctx;
  uint32_t *ctx_r20 = ctx + 8U;
  from(ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, 8U * sizeof (uint32_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint32_t *t11 = table + (i + 1U) * 8U;
    uint32_t *ctx_n1 = ctx;
    amont_sqr(ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * 8U, tmp, 8U * sizeof (uint32_t));
    uint32_t *t2 = table + (2U * i + 2U) * 8U;
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * 8U, tmp, 8U * sizeof (uint32_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
    memcpy(resM, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = resM;
        uint32_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;););
  }
  else
  {
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
  }
  uint32_t tmp0[8U] = { 0U };
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint32_t *ctx_n = ctx;
      amont_sqr(ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k, 4U);
    memcpy(tmp0, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = tmp0;
        uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;););
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, resM, tmp0, resM);
  }
  from(n, mu, resM, res);
}